

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjFaninC2(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint *puVar1;
  int iVar2;
  
  puVar1 = p->pMuxes;
  if (puVar1 != (uint *)0x0) {
    iVar2 = Gia_ObjId(p,pObj);
    iVar2 = Abc_LitIsCompl(puVar1[iVar2]);
    return iVar2;
  }
  return 0;
}

Assistant:

static inline int          Gia_ObjFaninC2( Gia_Man_t * p, Gia_Obj_t * pObj )   { return p->pMuxes && Abc_LitIsCompl(p->pMuxes[Gia_ObjId(p, pObj)]);  }